

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
                       ZSTD_tableFillPurpose_e tfp)

{
  uint uVar1;
  uint uVar2;
  U32 *hashTable;
  BYTE *pBVar3;
  char cVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  char *__function;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  char *__assertion;
  int iVar13;
  ulong uVar14;
  int local_40;
  
  hashTable = ms->hashTable;
  uVar1 = (ms->cParams).minMatch;
  if (tfp == ZSTD_tfp_forCDict) {
    if (dtlm != ZSTD_dtlm_full) {
      __assertion = "dtlm == ZSTD_dtlm_full";
      __function = 
      "void ZSTD_fillHashTableForCDict(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
      ;
      uVar1 = 0x1d;
LAB_001b77e9:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,uVar1,__function);
    }
    pBVar3 = (ms->window).base;
    iVar5 = ms->nextToUpdate + 1;
    uVar2 = (ms->cParams).hashLog;
    cVar4 = (char)uVar2;
    bVar6 = 0x38 - cVar4;
    bVar7 = 0x18 - cVar4;
    iVar13 = uVar1 - 5;
    plVar9 = (long *)(pBVar3 + ms->nextToUpdate);
    while ((long *)((long)plVar9 + 3U) < (long *)((long)end - 6U)) {
      if (0x20 < uVar2 + 8) {
LAB_001b779a:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(iVar13) {
      case 0:
        uVar10 = *plVar9 * -0x30e4432345000000;
        break;
      case 1:
        lVar8 = -0x30e4432340650000;
        goto LAB_001b75ec;
      case 2:
        lVar8 = -0x30e44323405a9d00;
LAB_001b75ec:
        uVar10 = lVar8 * *plVar9;
        break;
      case 3:
        uVar10 = *plVar9 * -0x30e44323485a9b9d;
        break;
      default:
        sVar11 = (size_t)((uint)((int)*plVar9 * -0x61c8864f) >> (bVar7 & 0x1f));
        goto LAB_001b75f7;
      }
      sVar11 = uVar10 >> (bVar6 & 0x3f);
LAB_001b75f7:
      local_40 = (int)pBVar3;
      ZSTD_writeTaggedIndex(hashTable,sVar11,(int)plVar9 - local_40);
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        switch(iVar13) {
        case 0:
          uVar10 = *(long *)((long)plVar9 + lVar8 + 1) * -0x30e4432345000000;
          break;
        case 1:
          lVar12 = -0x30e4432340650000;
          goto LAB_001b766b;
        case 2:
          lVar12 = -0x30e44323405a9d00;
LAB_001b766b:
          uVar10 = lVar12 * *(long *)((long)plVar9 + lVar8 + 1);
          break;
        case 3:
          uVar10 = *(long *)((long)plVar9 + lVar8 + 1) * -0x30e44323485a9b9d;
          break;
        default:
          sVar11 = (size_t)((uint)(*(int *)((long)plVar9 + lVar8 + 1) * -0x61c8864f) >>
                           (bVar7 & 0x1f));
          goto LAB_001b7677;
        }
        sVar11 = uVar10 >> (bVar6 & 0x3f);
LAB_001b7677:
        if (hashTable[sVar11 >> 8] == 0) {
          ZSTD_writeTaggedIndex(hashTable,sVar11,iVar5 + (int)lVar8);
        }
      }
      iVar5 = iVar5 + 3;
      plVar9 = (long *)((long)plVar9 + 3U);
    }
  }
  else {
    if (dtlm != ZSTD_dtlm_fast) {
      __assertion = "dtlm == ZSTD_dtlm_fast";
      __function = 
      "void ZSTD_fillHashTableForCCtx(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
      ;
      uVar1 = 0x40;
      goto LAB_001b77e9;
    }
    uVar10 = (ulong)ms->nextToUpdate;
    uVar2 = (ms->cParams).hashLog;
    cVar4 = (char)uVar2;
    plVar9 = (long *)((ms->window).base + uVar10);
    while ((long *)((long)plVar9 + 3) < (long *)((long)end - 6U)) {
      if (0x20 < uVar2) goto LAB_001b779a;
      switch(uVar1) {
      case 5:
        uVar14 = *plVar9 * -0x30e4432345000000;
        break;
      case 6:
        uVar14 = *plVar9 * -0x30e4432340650000;
        break;
      case 7:
        uVar14 = *plVar9 * -0x30e44323405a9d00;
        break;
      case 8:
        uVar14 = *plVar9 * -0x30e44323485a9b9d;
        break;
      default:
        uVar14 = (ulong)((uint)((int)*plVar9 * -0x61c8864f) >> (0x20U - cVar4 & 0x1f));
        goto LAB_001b776e;
      }
      uVar14 = uVar14 >> (0x40U - cVar4 & 0x3f);
LAB_001b776e:
      hashTable[uVar14] = (U32)uVar10;
      uVar10 = (ulong)((U32)uVar10 + 3);
      plVar9 = (long *)((long)plVar9 + 3);
    }
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillHashTableForCCtx(ms, end, dtlm);
    }
}